

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestLocusIntersect.cpp
# Opt level: O0

bool ParseLocusIntersect(string *sLine1,string *sLine2,string *sLine3)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  ostream *poVar4;
  double dVar5;
  double dVar6;
  string local_738;
  double local_718;
  double dLon;
  double local_6f0;
  double dLat;
  undefined1 local_6e0 [8];
  string sPtIntLon_1;
  undefined1 local_6b8 [8];
  string sPtIntLat_1;
  undefined1 local_690 [8];
  string sPtIntLon;
  undefined1 local_668 [8];
  string sPtIntLat;
  undefined1 auStack_640 [4];
  int nVal;
  LLPoint intersection;
  string local_610;
  string local_5f0;
  string local_5d0;
  string local_5b0;
  string local_590;
  string local_570;
  string local_550;
  string local_530;
  string local_510;
  string local_4f0;
  string local_4d0;
  string local_4b0;
  string local_490;
  string local_470;
  string local_450;
  undefined1 local_430 [8];
  Locus locus2;
  Locus locus1;
  string local_360;
  undefined4 local_340;
  string local_330;
  undefined1 local_310 [8];
  string sTestId;
  string sIntersection1Long;
  string sIntersection1Lat;
  string sLocus2EndDist;
  string sLocus2StartDist;
  string sLocus2EndLong;
  string sLocus2EndLat;
  string sLocus2StartLong;
  string sLocus2StartLat;
  string sLocus2GeoEndLong;
  string sLocus2GeoEndLat;
  string sLocus2GeoStartLong;
  string sLocus2GeoStartLat;
  string sLocus1EndDist;
  string sLocus1StartDist;
  string sLocus1EndLong;
  string sLocus1EndLat;
  string sLocus1StartLong;
  string sLocus1StartLat;
  string sLocus1GeoEndLong;
  string sLocus1GeoEndLat;
  string sLocus1GeoStartLong;
  string sLocus1GeoStartLat;
  bool bPassed;
  string *sLine3_local;
  string *sLine2_local;
  string *sLine1_local;
  
  sLocus1GeoStartLat.field_2._M_local_buf[0xf] = '\x01';
  std::__cxx11::string::string((string *)(sLocus1GeoStartLong.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sLocus1GeoEndLat.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sLocus1GeoEndLong.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sLocus1StartLat.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sLocus1StartLong.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sLocus1EndLat.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sLocus1EndLong.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sLocus1StartDist.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sLocus1EndDist.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sLocus2GeoStartLat.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sLocus2GeoStartLong.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sLocus2GeoEndLat.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sLocus2GeoEndLong.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sLocus2StartLat.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sLocus2StartLong.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sLocus2EndLat.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sLocus2EndLong.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sLocus2StartDist.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sLocus2EndDist.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sIntersection1Lat.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sIntersection1Long.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sTestId.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_310);
  std::__cxx11::string::string((string *)&local_330,(string *)sLine1);
  bVar1 = ParseLocusIntersect1
                    (&local_330,(string *)local_310,
                     (string *)((long)&sLocus1GeoStartLong.field_2 + 8),
                     (string *)((long)&sLocus1GeoEndLat.field_2 + 8),
                     (string *)((long)&sLocus1GeoEndLong.field_2 + 8),
                     (string *)((long)&sLocus1StartLat.field_2 + 8),
                     (string *)((long)&sLocus1StartLong.field_2 + 8),
                     (string *)((long)&sLocus1EndLat.field_2 + 8),
                     (string *)((long)&sLocus1EndLong.field_2 + 8),
                     (string *)((long)&sLocus1StartDist.field_2 + 8),
                     (string *)((long)&sLocus1EndDist.field_2 + 8),
                     (string *)((long)&sLocus2GeoStartLat.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_330);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::__cxx11::string::string((string *)&local_360,(string *)sLine2);
    bVar1 = ParseLocusIntersect2
                      (&local_360,(string *)((long)&sLocus2GeoStartLong.field_2 + 8),
                       (string *)((long)&sLocus2GeoEndLat.field_2 + 8),
                       (string *)((long)&sLocus2GeoEndLong.field_2 + 8),
                       (string *)((long)&sLocus2StartLat.field_2 + 8),
                       (string *)((long)&sLocus2StartLong.field_2 + 8),
                       (string *)((long)&sLocus2EndLat.field_2 + 8),
                       (string *)((long)&sLocus2EndLong.field_2 + 8),
                       (string *)((long)&sLocus2StartDist.field_2 + 8),
                       (string *)((long)&sLocus2EndDist.field_2 + 8),
                       (string *)((long)&sIntersection1Lat.field_2 + 8));
    std::__cxx11::string::~string((string *)&local_360);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      std::__cxx11::string::string((string *)&locus1.lineType,(string *)sLine3);
      bVar1 = ParseLocusIntersect3
                        ((string *)&locus1.lineType,
                         (string *)((long)&sIntersection1Long.field_2 + 8),
                         (string *)((long)&sTestId.field_2 + 8));
      std::__cxx11::string::~string((string *)&locus1.lineType);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        GeoCalcs::LOCUS::LOCUS((LOCUS *)&locus2.lineType);
        GeoCalcs::LOCUS::LOCUS((LOCUS *)local_430);
        std::__cxx11::string::string
                  ((string *)&local_450,(string *)(sLocus1GeoStartLong.field_2._M_local_buf + 8));
        dVar5 = ParseLatitude(&local_450);
        dVar5 = Deg2Rad(dVar5);
        std::__cxx11::string::string
                  ((string *)&local_470,(string *)(sLocus1GeoEndLat.field_2._M_local_buf + 8));
        dVar6 = ParseLongitude(&local_470);
        dVar6 = Deg2Rad(dVar6);
        GeoCalcs::LLPOINT::Set((LLPOINT *)&locus2.lineType,dVar5,dVar6);
        std::__cxx11::string::~string((string *)&local_470);
        std::__cxx11::string::~string((string *)&local_450);
        std::__cxx11::string::string
                  ((string *)&local_490,(string *)(sLocus1GeoEndLong.field_2._M_local_buf + 8));
        dVar5 = ParseLatitude(&local_490);
        dVar5 = Deg2Rad(dVar5);
        std::__cxx11::string::string
                  ((string *)&local_4b0,(string *)(sLocus1StartLat.field_2._M_local_buf + 8));
        dVar6 = ParseLongitude(&local_4b0);
        dVar6 = Deg2Rad(dVar6);
        GeoCalcs::LLPOINT::Set((LLPOINT *)&locus1.geoStart.longitude,dVar5,dVar6);
        std::__cxx11::string::~string((string *)&local_4b0);
        std::__cxx11::string::~string((string *)&local_490);
        std::__cxx11::string::string
                  ((string *)&local_4d0,(string *)(sLocus1StartLong.field_2._M_local_buf + 8));
        dVar5 = ParseLatitude(&local_4d0);
        dVar5 = Deg2Rad(dVar5);
        std::__cxx11::string::string
                  ((string *)&local_4f0,(string *)(sLocus1EndLat.field_2._M_local_buf + 8));
        dVar6 = ParseLongitude(&local_4f0);
        dVar6 = Deg2Rad(dVar6);
        GeoCalcs::LLPOINT::Set((LLPOINT *)&locus1.geoEnd.longitude,dVar5,dVar6);
        std::__cxx11::string::~string((string *)&local_4f0);
        std::__cxx11::string::~string((string *)&local_4d0);
        std::__cxx11::string::string
                  ((string *)&local_510,(string *)(sLocus1EndLong.field_2._M_local_buf + 8));
        dVar5 = ParseLatitude(&local_510);
        dVar5 = Deg2Rad(dVar5);
        std::__cxx11::string::string
                  ((string *)&local_530,(string *)(sLocus1StartDist.field_2._M_local_buf + 8));
        dVar6 = ParseLongitude(&local_530);
        dVar6 = Deg2Rad(dVar6);
        GeoCalcs::LLPOINT::Set((LLPOINT *)&locus1.locusStart.longitude,dVar5,dVar6);
        std::__cxx11::string::~string((string *)&local_530);
        std::__cxx11::string::~string((string *)&local_510);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        dVar5 = atof(pcVar3);
        locus1.locusEnd.longitude = NmToMeters(dVar5);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        dVar5 = atof(pcVar3);
        locus1.startDist = NmToMeters(dVar5);
        locus1.endDist._0_4_ = 0;
        std::__cxx11::string::string
                  ((string *)&local_550,(string *)(sLocus2GeoStartLong.field_2._M_local_buf + 8));
        dVar5 = ParseLatitude(&local_550);
        dVar5 = Deg2Rad(dVar5);
        std::__cxx11::string::string
                  ((string *)&local_570,(string *)(sLocus2GeoEndLat.field_2._M_local_buf + 8));
        dVar6 = ParseLongitude(&local_570);
        dVar6 = Deg2Rad(dVar6);
        GeoCalcs::LLPOINT::Set((LLPOINT *)local_430,dVar5,dVar6);
        std::__cxx11::string::~string((string *)&local_570);
        std::__cxx11::string::~string((string *)&local_550);
        std::__cxx11::string::string
                  ((string *)&local_590,(string *)(sLocus2GeoEndLong.field_2._M_local_buf + 8));
        dVar5 = ParseLatitude(&local_590);
        dVar5 = Deg2Rad(dVar5);
        std::__cxx11::string::string
                  ((string *)&local_5b0,(string *)(sLocus2StartLat.field_2._M_local_buf + 8));
        dVar6 = ParseLongitude(&local_5b0);
        dVar6 = Deg2Rad(dVar6);
        GeoCalcs::LLPOINT::Set((LLPOINT *)&locus2.geoStart.longitude,dVar5,dVar6);
        std::__cxx11::string::~string((string *)&local_5b0);
        std::__cxx11::string::~string((string *)&local_590);
        std::__cxx11::string::string
                  ((string *)&local_5d0,(string *)(sLocus2StartLong.field_2._M_local_buf + 8));
        dVar5 = ParseLatitude(&local_5d0);
        dVar5 = Deg2Rad(dVar5);
        std::__cxx11::string::string
                  ((string *)&local_5f0,(string *)(sLocus2EndLat.field_2._M_local_buf + 8));
        dVar6 = ParseLongitude(&local_5f0);
        dVar6 = Deg2Rad(dVar6);
        GeoCalcs::LLPOINT::Set((LLPOINT *)&locus2.geoEnd.longitude,dVar5,dVar6);
        std::__cxx11::string::~string((string *)&local_5f0);
        std::__cxx11::string::~string((string *)&local_5d0);
        std::__cxx11::string::string
                  ((string *)&local_610,(string *)(sLocus2EndLong.field_2._M_local_buf + 8));
        dVar5 = ParseLatitude(&local_610);
        dVar5 = Deg2Rad(dVar5);
        std::__cxx11::string::string
                  ((string *)&intersection.longitude,
                   (string *)(sLocus2StartDist.field_2._M_local_buf + 8));
        dVar6 = ParseLongitude((string *)&intersection.longitude);
        dVar6 = Deg2Rad(dVar6);
        GeoCalcs::LLPOINT::Set((LLPOINT *)&locus2.locusStart.longitude,dVar5,dVar6);
        std::__cxx11::string::~string((string *)&intersection.longitude);
        std::__cxx11::string::~string((string *)&local_610);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        dVar5 = atof(pcVar3);
        locus2.locusEnd.longitude = NmToMeters(dVar5);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        dVar5 = atof(pcVar3);
        locus2.startDist = NmToMeters(dVar5);
        locus2.endDist._0_4_ = 0;
        GeoCalcs::LLPOINT::LLPOINT((LLPOINT *)auStack_640);
        sPtIntLat.field_2._12_4_ =
             GeoCalcs::LocusIntersect
                       ((Locus *)&locus2.lineType,(Locus *)local_430,(LLPoint *)auStack_640,1e-09,
                        5e-16);
        if (sPtIntLat.field_2._12_4_ == 0) {
          iVar2 = std::__cxx11::string::compare(sIntersection1Long.field_2._M_local_buf + 8);
          if (iVar2 != 0) {
            sPtIntLon.field_2._8_8_ = Rad2Deg(_auStack_640);
            ConvertLatitudeDdToDms_abi_cxx11_
                      ((string *)local_668,(double *)((long)&sPtIntLon.field_2 + 8));
            sPtIntLat_1.field_2._8_8_ = Rad2Deg(intersection.latitude);
            ConvertLongitudeDdToDms_abi_cxx11_
                      ((string *)local_690,(double *)((long)&sPtIntLat_1.field_2 + 8));
            poVar4 = std::operator<<((ostream *)&std::cout,"\n");
            poVar4 = std::operator<<(poVar4,(string *)local_310);
            poVar4 = std::operator<<(poVar4,"failed: Expected solution of: ");
            poVar4 = std::operator<<(poVar4,(string *)(sIntersection1Long.field_2._M_local_buf + 8))
            ;
            poVar4 = std::operator<<(poVar4," ");
            poVar4 = std::operator<<(poVar4,(string *)(sTestId.field_2._M_local_buf + 8));
            std::operator<<(poVar4," but none was found");
            std::__cxx11::string::~string((string *)local_690);
            std::__cxx11::string::~string((string *)local_668);
          }
          sLocus1GeoStartLat.field_2._M_local_buf[0xf] = iVar2 == 0;
        }
        else {
          sPtIntLon_1.field_2._8_8_ = Rad2Deg(_auStack_640);
          ConvertLatitudeDdToDms_abi_cxx11_
                    ((string *)local_6b8,(double *)((long)&sPtIntLon_1.field_2 + 8));
          dLat = Rad2Deg(intersection.latitude);
          ConvertLongitudeDdToDms_abi_cxx11_((string *)local_6e0,&dLat);
          iVar2 = std::__cxx11::string::compare((string *)local_6b8);
          if (iVar2 != 0) {
            std::__cxx11::string::string
                      ((string *)&dLon,(string *)(sIntersection1Long.field_2._M_local_buf + 8));
            dVar5 = ParseLatitude((string *)&dLon);
            dVar5 = Deg2Rad(dVar5);
            std::__cxx11::string::~string((string *)&dLon);
            local_6f0 = dVar5;
            sLocus1GeoStartLat.field_2._M_local_buf[0xf] = IsApprox(dVar5,_auStack_640,1e-10);
            if ((bool)sLocus1GeoStartLat.field_2._M_local_buf[0xf]) {
              poVar4 = std::operator<<((ostream *)&std::cout,"\n");
              poVar4 = std::operator<<(poVar4,(string *)local_310);
              poVar4 = std::operator<<(poVar4,
                                       " within rounding tolerance of 1e-10: Intersect 1 Latitude: "
                                      );
              poVar4 = std::operator<<(poVar4,(string *)
                                              (sIntersection1Long.field_2._M_local_buf + 8));
              poVar4 = std::operator<<(poVar4," calced: ");
              std::operator<<(poVar4,(string *)local_6b8);
            }
            else {
              poVar4 = std::operator<<((ostream *)&std::cout,"\n");
              poVar4 = std::operator<<(poVar4,(string *)local_310);
              poVar4 = std::operator<<(poVar4," failed: Expected Intersect 1 latitude: ");
              poVar4 = std::operator<<(poVar4,(string *)
                                              (sIntersection1Long.field_2._M_local_buf + 8));
              poVar4 = std::operator<<(poVar4,"  calced: ");
              std::operator<<(poVar4,(string *)local_6b8);
            }
          }
          iVar2 = std::__cxx11::string::compare((string *)local_6e0);
          if (iVar2 != 0) {
            std::__cxx11::string::string
                      ((string *)&local_738,(string *)(sTestId.field_2._M_local_buf + 8));
            dVar5 = ParseLongitude(&local_738);
            dVar5 = Deg2Rad(dVar5);
            std::__cxx11::string::~string((string *)&local_738);
            local_718 = dVar5;
            bVar1 = IsApprox(dVar5,intersection.latitude,1e-10);
            if (bVar1) {
              poVar4 = std::operator<<((ostream *)&std::cout,"\n");
              poVar4 = std::operator<<(poVar4,(string *)local_310);
              poVar4 = std::operator<<(poVar4,
                                       " within rounding tolerance of 1e-10: Intersect 1 Longitude: "
                                      );
              poVar4 = std::operator<<(poVar4,(string *)(sTestId.field_2._M_local_buf + 8));
              poVar4 = std::operator<<(poVar4," calced: ");
              std::operator<<(poVar4,(string *)local_6e0);
            }
            else {
              poVar4 = std::operator<<((ostream *)&std::cout,"\n");
              poVar4 = std::operator<<(poVar4,(string *)local_310);
              poVar4 = std::operator<<(poVar4," failed: Expected Intersect 1 longitude: ");
              poVar4 = std::operator<<(poVar4,(string *)(sTestId.field_2._M_local_buf + 8));
              poVar4 = std::operator<<(poVar4,"  calced: ");
              std::operator<<(poVar4,(string *)local_6e0);
              sLocus1GeoStartLat.field_2._M_local_buf[0xf] = '\0';
            }
          }
          std::__cxx11::string::~string((string *)local_6e0);
          std::__cxx11::string::~string((string *)local_6b8);
        }
        sLine1_local._7_1_ = (bool)sLocus1GeoStartLat.field_2._M_local_buf[0xf];
      }
      else {
        sLine1_local._7_1_ = false;
      }
    }
    else {
      sLine1_local._7_1_ = false;
    }
  }
  else {
    sLine1_local._7_1_ = false;
  }
  local_340 = 1;
  std::__cxx11::string::~string((string *)local_310);
  std::__cxx11::string::~string((string *)(sTestId.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sIntersection1Long.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sIntersection1Lat.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sLocus2EndDist.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sLocus2StartDist.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sLocus2EndLong.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sLocus2EndLat.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sLocus2StartLong.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sLocus2StartLat.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sLocus2GeoEndLong.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sLocus2GeoEndLat.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sLocus2GeoStartLong.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sLocus2GeoStartLat.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sLocus1EndDist.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sLocus1StartDist.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sLocus1EndLong.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sLocus1EndLat.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sLocus1StartLong.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sLocus1StartLat.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sLocus1GeoEndLong.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sLocus1GeoEndLat.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sLocus1GeoStartLong.field_2._M_local_buf + 8));
  return sLine1_local._7_1_;
}

Assistant:

bool ParseLocusIntersect(string sLine1, string sLine2, string sLine3)
{
    bool bPassed = true;

    string sLocus1GeoStartLat, sLocus1GeoStartLong, sLocus1GeoEndLat, sLocus1GeoEndLong;
    string sLocus1StartLat, sLocus1StartLong, sLocus1EndLat, sLocus1EndLong;
    string sLocus1StartDist, sLocus1EndDist;

    string sLocus2GeoStartLat, sLocus2GeoStartLong, sLocus2GeoEndLat, sLocus2GeoEndLong;
    string sLocus2StartLat, sLocus2StartLong, sLocus2EndLat, sLocus2EndLong;
    string sLocus2StartDist, sLocus2EndDist;

    string sIntersection1Lat, sIntersection1Long;
    string sTestId;

    if (!ParseLocusIntersect1(sLine1, sTestId, sLocus1GeoStartLat, sLocus1GeoStartLong, sLocus1GeoEndLat,
                              sLocus1GeoEndLong,
                              sLocus1StartLat, sLocus1StartLong, sLocus1EndLat, sLocus1EndLong, sLocus1StartDist,
                              sLocus1EndDist))
        return false;

    if (!ParseLocusIntersect2(sLine2, sLocus2GeoStartLat, sLocus2GeoStartLong, sLocus2GeoEndLat, sLocus2GeoEndLong,
                              sLocus2StartLat, sLocus2StartLong, sLocus2EndLat, sLocus2EndLong, sLocus2StartDist,
                              sLocus2EndDist))
        return false;

    if (!ParseLocusIntersect3(sLine3, sIntersection1Lat, sIntersection1Long))
        return false;

    Locus locus1, locus2;
    locus1.geoStart.Set(Deg2Rad(ParseLatitude(sLocus1GeoStartLat)), Deg2Rad(ParseLongitude(sLocus1GeoStartLong)));
    locus1.geoEnd.Set(Deg2Rad(ParseLatitude(sLocus1GeoEndLat)), Deg2Rad(ParseLongitude(sLocus1GeoEndLong)));
    locus1.locusStart.Set(Deg2Rad(ParseLatitude(sLocus1StartLat)), Deg2Rad(ParseLongitude(sLocus1StartLong)));
    locus1.locusEnd.Set(Deg2Rad(ParseLatitude(sLocus1EndLat)), Deg2Rad(ParseLongitude(sLocus1EndLong)));
    locus1.startDist = NmToMeters(atof(sLocus1StartDist.c_str()));
    locus1.endDist = NmToMeters(atof(sLocus1EndDist.c_str()));
    locus1.lineType = 0;

    locus2.geoStart.Set(Deg2Rad(ParseLatitude(sLocus2GeoStartLat)), Deg2Rad(ParseLongitude(sLocus2GeoStartLong)));
    locus2.geoEnd.Set(Deg2Rad(ParseLatitude(sLocus2GeoEndLat)), Deg2Rad(ParseLongitude(sLocus2GeoEndLong)));
    locus2.locusStart.Set(Deg2Rad(ParseLatitude(sLocus2StartLat)), Deg2Rad(ParseLongitude(sLocus2StartLong)));
    locus2.locusEnd.Set(Deg2Rad(ParseLatitude(sLocus2EndLat)), Deg2Rad(ParseLongitude(sLocus2EndLong)));
    locus2.startDist = NmToMeters(atof(sLocus2StartDist.c_str()));
    locus2.endDist = NmToMeters(atof(sLocus2EndDist.c_str()));
    locus2.lineType = 0;

    LLPoint intersection;

    int nVal = LocusIntersect(locus1, locus2, intersection, kTol, kEps);

    if (nVal == 0)
    {
        if (sIntersection1Lat.compare("N/A") != 0)
        {
            string sPtIntLat = ConvertLatitudeDdToDms(Rad2Deg(intersection.latitude));
            string sPtIntLon = ConvertLongitudeDdToDms(Rad2Deg(intersection.longitude));
            cout << "\n" << sTestId << "failed: Expected solution of: " << sIntersection1Lat << " " <<
            sIntersection1Long << " but none was found";
            bPassed = false;
        }
    }
    else
    {
        string sPtIntLat = ConvertLatitudeDdToDms(Rad2Deg(intersection.latitude));
        string sPtIntLon = ConvertLongitudeDdToDms(Rad2Deg(intersection.longitude));
        if (sPtIntLat.compare(sIntersection1Lat) != 0)
        {
            double dLat = Deg2Rad(ParseLatitude(sIntersection1Lat));
            if (IsApprox(dLat, intersection.latitude, 1e-10))
                cout << "\n" << sTestId << " within rounding tolerance of 1e-10: Intersect 1 Latitude: " <<
                sIntersection1Lat << " calced: " << sPtIntLat;
            else
            {
                cout << "\n" << sTestId << " failed: Expected Intersect 1 latitude: " << sIntersection1Lat <<
                "  calced: " << sPtIntLat;
                bPassed = false;
            }
        }
        if (sPtIntLon.compare(sIntersection1Long) != 0)
        {
            double dLon = Deg2Rad(ParseLongitude(sIntersection1Long));
            if (IsApprox(dLon, intersection.longitude, 1e-10))
                cout << "\n" << sTestId << " within rounding tolerance of 1e-10: Intersect 1 Longitude: " <<
                sIntersection1Long << " calced: " << sPtIntLon;
            else
            {
                cout << "\n" << sTestId << " failed: Expected Intersect 1 longitude: " << sIntersection1Long <<
                "  calced: " << sPtIntLon;
                bPassed = false;
            }
        }
    }
    return bPassed;
}